

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp.cpp
# Opt level: O3

ll fastexp(ll a,ll p,ll mod)

{
  ll lVar1;
  ulong uVar2;
  long lVar3;
  
  lVar1 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1)) % SEXT816(mod),0);
  if (p != 0) {
    lVar3 = a % mod + mod;
    do {
      lVar3 = lVar3 % mod;
      if ((p & 1U) != 0) {
        lVar1 = (lVar1 * lVar3) % mod;
      }
      lVar3 = lVar3 * lVar3;
      uVar2 = p + 1;
      p = p / 2;
    } while (2 < uVar2);
  }
  return lVar1;
}

Assistant:

ll fastexp(ll a, ll p, ll mod) {
	a = ((a % mod) + mod) % mod; /// so many mod's because of corner cases
	ll res = 1 % mod;
	for (; p; a = (a * a) % mod, p /= 2)
		if (p % 2)
			res = (res * a) % mod;
	return res;
}